

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O3

int PEM_read_bio(BIO *bp,char **name,char **header,uchar **data,long *len)

{
  ulong uVar1;
  char *__s;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  BUF_MEM *a;
  BUF_MEM *pBVar6;
  BUF_MEM *str;
  size_t sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong __n;
  ulong uVar8;
  long lVar9;
  int bl;
  int k;
  char buf [256];
  EVP_ENCODE_CTX ctx;
  int local_1ac;
  BUF_MEM *local_1a8;
  BUF_MEM *local_1a0;
  BUF_MEM *local_198;
  undefined4 local_190;
  int local_18c;
  char **local_188;
  uchar **local_180;
  char **local_178;
  long *local_170;
  char local_168;
  undefined2 uStack_167;
  undefined5 uStack_165;
  char local_160;
  undefined2 local_15f;
  char local_15d [243];
  undefined1 local_6a;
  
  local_1ac = 0;
  local_178 = name;
  local_170 = len;
  a = BUF_MEM_new();
  pBVar6 = BUF_MEM_new();
  str = BUF_MEM_new();
  if (str != (BUF_MEM *)0x0 && (pBVar6 != (BUF_MEM *)0x0 && a != (BUF_MEM *)0x0)) {
    local_6a = 0;
    local_1a8 = pBVar6;
    local_1a0 = str;
    local_198 = a;
    local_188 = header;
    local_180 = data;
    uVar3 = BIO_gets(bp,&local_168,0xfe);
    if (0 < (int)uVar3) {
LAB_0018ff90:
      do {
        if ((&local_168)[uVar3] < '!') {
          bVar2 = 0 < (int)uVar3;
          uVar3 = uVar3 - 1;
          if (bVar2) goto LAB_0018ff90;
          uVar3 = 0xffffffff;
        }
        (&local_168)[uVar3 + 1] = '\n';
        (&local_168)[uVar3 + 2] = '\0';
        if (CONCAT26(local_15f,CONCAT15(local_160,uStack_165)) == 0x204e494745422d2d &&
            CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x4745422d2d2d2d2d) {
          sVar7 = strlen(local_15d);
          lVar9 = sVar7 << 0x20;
          iVar4 = strncmp(&local_168 + (lVar9 + 0x500000000 >> 0x20),"-----\n",6);
          a = local_198;
          if (iVar4 == 0) {
            iVar4 = BUF_MEM_grow(local_198,lVar9 + 0x900000000 >> 0x20);
            str = local_1a0;
            pBVar6 = local_1a8;
            if (CONCAT44(extraout_var,iVar4) == 0) goto LAB_0019004f;
            sVar7 = lVar9 + -0x600000000 >> 0x20;
            if (lVar9 + -0x600000000 != 0) {
              memcpy(a->data,local_15d,sVar7);
            }
            a->data[sVar7] = '\0';
            iVar4 = BUF_MEM_grow(pBVar6,0x100);
            if (CONCAT44(extraout_var_00,iVar4) == 0) goto LAB_0019004f;
            *pBVar6->data = '\0';
            uVar3 = BIO_gets(bp,&local_168,0xfe);
            local_190 = (undefined4)CONCAT71((uint7)(uint3)(uVar3 >> 8),1);
            uVar8 = 0;
            iVar4 = 0;
            goto joined_r0x0019012c;
          }
        }
        uVar3 = BIO_gets(bp,&local_168,0xfe);
      } while (0 < (int)uVar3);
    }
    ERR_put_error(9,0,0x6e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x23f);
    str = local_1a0;
    a = local_198;
    pBVar6 = local_1a8;
  }
LAB_0019004f:
  BUF_MEM_free(a);
  BUF_MEM_free(pBVar6);
  BUF_MEM_free(str);
  return 0;
joined_r0x0019012c:
  if ((int)uVar3 < 1) goto LAB_00190207;
  do {
    iVar4 = (int)uVar8;
    if (' ' < (&local_168)[uVar3]) goto LAB_0019014e;
    bVar2 = 0 < (int)uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar2);
  uVar3 = 0xffffffff;
LAB_0019014e:
  (&local_168)[uVar3 + 1] = '\n';
  __n = (ulong)(uVar3 + 2);
  (&local_168)[__n] = '\0';
  str = local_1a0;
  if (local_168 == '\n') goto LAB_00190207;
  uVar1 = uVar8 + __n;
  iVar5 = BUF_MEM_grow(local_1a8,(ulong)((int)uVar1 + 9));
  pBVar6 = local_1a8;
  str = local_1a0;
  a = local_198;
  if (CONCAT44(extraout_var_01,iVar5) == 0) goto LAB_0019004f;
  if (local_160 == ' ' && CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x444e452d2d2d2d2d)
  {
    local_190 = 0;
    goto LAB_00190207;
  }
  memcpy(local_1a8->data + uVar8,&local_168,__n);
  pBVar6->data[uVar1] = '\0';
  uVar3 = BIO_gets(bp,&local_168,0xfe);
  uVar8 = uVar1 & 0xffffffff;
  iVar4 = (int)uVar1;
  str = local_1a0;
  goto joined_r0x0019012c;
LAB_00190207:
  local_1ac = 0;
  iVar5 = BUF_MEM_grow(str,0x400);
  a = local_198;
  pBVar6 = local_1a8;
  if (CONCAT44(extraout_var_02,iVar5) != 0) {
    *str->data = '\0';
    if ((char)local_190 == '\0') {
      local_1a0 = local_1a8;
      pBVar6 = str;
      local_1ac = iVar4;
    }
    else {
      iVar4 = 0;
      do {
        uVar3 = BIO_gets(bp,&local_168,0xfe);
        pBVar6 = local_1a8;
        if ((int)uVar3 < 1) goto LAB_0019035d;
        do {
          if (' ' < (&local_168)[uVar3]) goto LAB_0019026e;
          bVar2 = 0 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar2);
        uVar3 = 0xffffffff;
LAB_0019026e:
        (&local_168)[uVar3 + 1] = '\n';
        uVar8 = (ulong)(uVar3 + 2);
        (&local_168)[uVar8] = '\0';
        if ((0x3f < (int)uVar3) ||
           (local_160 == ' ' &&
            CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x444e452d2d2d2d2d))
        goto LAB_0019035d;
        iVar5 = BUF_MEM_grow_clean(str,(long)(int)(uVar3 + iVar4 + 0xb));
        a = local_198;
        pBVar6 = local_1a8;
        if (CONCAT44(extraout_var_03,iVar5) == 0) goto LAB_0019004f;
        memcpy(str->data + iVar4,&local_168,uVar8);
        iVar4 = iVar4 + uVar3 + 2;
        str->data[iVar4] = '\0';
        local_1ac = iVar4;
      } while (uVar8 == 0x41);
      local_168 = '\0';
      uVar3 = BIO_gets(bp,&local_168,0xfe);
      pBVar6 = local_1a8;
      if (0 < (int)uVar3) {
        do {
          if (' ' < (&local_168)[uVar3]) goto LAB_0019032a;
          bVar2 = 0 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar2);
        uVar3 = 0xffffffff;
LAB_0019032a:
        (&local_168)[uVar3 + 1] = '\n';
        (&local_168)[uVar3 + 2] = '\0';
      }
    }
LAB_0019035d:
    a = local_198;
    if (local_160 == ' ' &&
        CONCAT53(uStack_165,CONCAT21(uStack_167,local_168)) == 0x444e452d2d2d2d2d) {
      __s = local_198->data;
      sVar7 = strlen(__s);
      iVar5 = strncmp(__s,(char *)&local_15f,(long)(int)sVar7);
      if ((iVar5 == 0) &&
         (iVar5 = strncmp(&local_168 + ((long)((sVar7 << 0x20) + 0x900000000) >> 0x20),"-----\n",6),
         iVar5 == 0)) {
        EVP_DecodeInit((EVP_ENCODE_CTX *)&stack0xffffffffffffff98);
        str = local_1a0;
        iVar4 = EVP_DecodeUpdate((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,(uchar *)local_1a0->data
                                 ,&local_1ac,(uchar *)local_1a0->data,iVar4);
        if (iVar4 < 0) {
          ERR_put_error(9,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                        ,0x2ba);
        }
        else {
          iVar4 = EVP_DecodeFinal((EVP_ENCODE_CTX *)&stack0xffffffffffffff98,
                                  (uchar *)(str->data + local_1ac),&local_18c);
          if (iVar4 < 0) {
            ERR_put_error(9,0,100,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                          ,0x2bf);
          }
          else {
            lVar9 = (long)local_1ac;
            local_1ac = (int)(lVar9 + local_18c);
            if (local_1ac != 0) {
              *local_178 = a->data;
              *local_188 = pBVar6->data;
              *local_180 = (uchar *)str->data;
              *local_170 = lVar9 + local_18c;
              OPENSSL_free(a);
              OPENSSL_free(pBVar6);
              OPENSSL_free(str);
              return 1;
            }
          }
        }
        goto LAB_0019004f;
      }
    }
    ERR_put_error(9,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x2b2);
    str = local_1a0;
  }
  goto LAB_0019004f;
}

Assistant:

int PEM_read_bio(BIO *bp, char **name, char **header, unsigned char **data,
                 long *len) {
  EVP_ENCODE_CTX ctx;
  int end = 0, i, k, bl = 0, hl = 0, nohead = 0;
  char buf[256];
  BUF_MEM *nameB;
  BUF_MEM *headerB;
  BUF_MEM *dataB, *tmpB;

  nameB = BUF_MEM_new();
  headerB = BUF_MEM_new();
  dataB = BUF_MEM_new();
  if ((nameB == NULL) || (headerB == NULL) || (dataB == NULL)) {
    BUF_MEM_free(nameB);
    BUF_MEM_free(headerB);
    BUF_MEM_free(dataB);
    return 0;
  }

  buf[254] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);

    if (i <= 0) {
      OPENSSL_PUT_ERROR(PEM, PEM_R_NO_START_LINE);
      goto err;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (strncmp(buf, "-----BEGIN ", 11) == 0) {
      i = strlen(&(buf[11]));

      if (strncmp(&(buf[11 + i - 6]), "-----\n", 6) != 0) {
        continue;
      }
      if (!BUF_MEM_grow(nameB, i + 9)) {
        goto err;
      }
      OPENSSL_memcpy(nameB->data, &(buf[11]), i - 6);
      nameB->data[i - 6] = '\0';
      break;
    }
  }
  hl = 0;
  if (!BUF_MEM_grow(headerB, 256)) {
    goto err;
  }
  headerB->data[0] = '\0';
  for (;;) {
    i = BIO_gets(bp, buf, 254);
    if (i <= 0) {
      break;
    }

    while ((i >= 0) && (buf[i] <= ' ')) {
      i--;
    }
    buf[++i] = '\n';
    buf[++i] = '\0';

    if (buf[0] == '\n') {
      break;
    }
    if (!BUF_MEM_grow(headerB, hl + i + 9)) {
      goto err;
    }
    if (strncmp(buf, "-----END ", 9) == 0) {
      nohead = 1;
      break;
    }
    OPENSSL_memcpy(&(headerB->data[hl]), buf, i);
    headerB->data[hl + i] = '\0';
    hl += i;
  }

  bl = 0;
  if (!BUF_MEM_grow(dataB, 1024)) {
    goto err;
  }
  dataB->data[0] = '\0';
  if (!nohead) {
    for (;;) {
      i = BIO_gets(bp, buf, 254);
      if (i <= 0) {
        break;
      }

      while ((i >= 0) && (buf[i] <= ' ')) {
        i--;
      }
      buf[++i] = '\n';
      buf[++i] = '\0';

      if (i != 65) {
        end = 1;
      }
      if (strncmp(buf, "-----END ", 9) == 0) {
        break;
      }
      if (i > 65) {
        break;
      }
      if (!BUF_MEM_grow_clean(dataB, i + bl + 9)) {
        goto err;
      }
      OPENSSL_memcpy(&(dataB->data[bl]), buf, i);
      dataB->data[bl + i] = '\0';
      bl += i;
      if (end) {
        buf[0] = '\0';
        i = BIO_gets(bp, buf, 254);
        if (i <= 0) {
          break;
        }

        while ((i >= 0) && (buf[i] <= ' ')) {
          i--;
        }
        buf[++i] = '\n';
        buf[++i] = '\0';

        break;
      }
    }
  } else {
    tmpB = headerB;
    headerB = dataB;
    dataB = tmpB;
    bl = hl;
  }
  i = strlen(nameB->data);
  if ((strncmp(buf, "-----END ", 9) != 0) ||
      (strncmp(nameB->data, &(buf[9]), i) != 0) ||
      (strncmp(&(buf[9 + i]), "-----\n", 6) != 0)) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_END_LINE);
    goto err;
  }

  EVP_DecodeInit(&ctx);
  i = EVP_DecodeUpdate(&ctx, (unsigned char *)dataB->data, &bl,
                       (unsigned char *)dataB->data, bl);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  i = EVP_DecodeFinal(&ctx, (unsigned char *)&(dataB->data[bl]), &k);
  if (i < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_BASE64_DECODE);
    goto err;
  }
  bl += k;

  if (bl == 0) {
    goto err;
  }
  *name = nameB->data;
  *header = headerB->data;
  *data = (unsigned char *)dataB->data;
  *len = bl;
  OPENSSL_free(nameB);
  OPENSSL_free(headerB);
  OPENSSL_free(dataB);
  return 1;
err:
  BUF_MEM_free(nameB);
  BUF_MEM_free(headerB);
  BUF_MEM_free(dataB);
  return 0;
}